

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O1

void __thiscall
nodecpp::log::Log::log<char_const*,unsigned_long>
          (Log *this,ModuleID *mid,LogLevel l,char *format_str,unsigned_long obj)

{
  pointer pLVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  LogTransport *transport;
  pointer this_00;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  char msgFormatted [4096];
  ModuleID local_1190;
  unsigned_long local_1188 [3];
  buffer<char> local_1170;
  ulong local_1150;
  long local_1148;
  char *local_1140;
  char local_1138 [256];
  char local_1038 [4104];
  
  if ((int)l <= (int)this->level) {
    local_1188[0] = obj;
    sVar2 = strlen(format_str);
    local_1150 = 0;
    local_1148 = 0xfff;
    local_1170.size_ = 0;
    local_1170.capacity_ = 0x100;
    local_1170._vptr_buffer = (_func_int **)&PTR_grow_00129a00;
    local_1140 = local_1038;
    format_str_00.size_ = sVar2;
    format_str_00.data_ = format_str;
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_1188;
    args.desc_ = 4;
    local_1170.ptr_ = local_1138;
    fmt::v7::detail::vformat_to<char>(&local_1170,format_str_00,args);
    uVar4 = local_1148 - local_1150;
    local_1150 = local_1150 + local_1170.size_;
    if (local_1170.size_ <= uVar4) {
      uVar4 = local_1170.size_;
    }
    if (uVar4 != 0) {
      memmove(local_1140,local_1138,uVar4);
    }
    uVar4 = local_1150;
    uVar3 = 0xfff;
    if (local_1150 < 0x1000) {
      uVar3 = local_1150;
    }
    local_1038[uVar3] = '\0';
    this_00 = (this->transports).
              super__Vector_base<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar1 = (this->transports).
             super__Vector_base<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pLVar1) {
      do {
        local_1190 = (ModuleID)mid->str;
        LogTransport::writoToLog(this_00,&local_1190,local_1038,uVar4,l,this->addTimeStamp);
        this_00 = this_00 + 1;
      } while (this_00 != pLVar1);
    }
  }
  return;
}

Assistant:

void log( ModuleID mid, LogLevel l, StringT format_str, Objects ... obj ) {
			if ( l <= level ) {
				char msgFormatted[LogBufferBaseData::maxMessageSize];
				auto r = ::fmt::format_to_n( msgFormatted, LogBufferBaseData::maxMessageSize-1, format_str, obj ... );
				if ( r.size >= LogBufferBaseData::maxMessageSize )
					msgFormatted[LogBufferBaseData::maxMessageSize-1] = 0;
				else
					msgFormatted[r.size] = 0;
				for ( auto& transport : transports )
					transport.writoToLog( mid, msgFormatted, r.size, l, addTimeStamp );
			}				 
		}